

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  uint64_t *puVar1;
  byte bVar2;
  undefined4 uVar3;
  uint *puVar4;
  lbool *plVar5;
  Watcher WVar6;
  watchItem *pwVar7;
  Watcher WVar8;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *pOVar9;
  ulong *puVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  Watcher *pWVar16;
  Lit LVar17;
  uint uVar18;
  int iVar19;
  Watcher *pWVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  Lit p;
  int iVar24;
  vec<Minisat::Watcher> *pvVar25;
  Watcher *pWVar26;
  long lVar27;
  Watcher w;
  Watcher *local_90;
  Watcher local_88;
  uint local_7c;
  Watcher *local_78;
  ulong local_70;
  watchItem local_68;
  vec<Minisat::Solver::watchItem> *local_58;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_50;
  vec<Minisat::Watcher> *local_48;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *local_40;
  ulong local_38;
  
  if ((this->lazySATwatch).data != (watchItem *)0x0) {
    (this->lazySATwatch).sz = 0;
  }
  local_50 = &this->watches;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (local_50);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches_bin);
  iVar19 = this->qhead;
  if (iVar19 < (this->trail).sz) {
    local_58 = &this->lazySATwatch;
    uVar12 = 0;
    uVar14 = 0xffffffff;
    LVar17.x = 0xfffffffe;
    local_40 = &this->watches_bin;
    do {
      pOVar9 = local_40;
      this->qhead = iVar19 + 1;
      uVar18 = (this->trail).data[iVar19].x;
      iVar19 = (this->vardata).data[(int)uVar18 >> 1].level;
      local_48 = (this->watches).occs.data + (int)uVar18;
      uVar22 = (int)uVar12 + 1;
      p.x = LVar17.x;
      if (this->use_backuped_trail == true) {
        iVar24 = this->old_trail_qhead;
        iVar11 = (this->old_trail).sz;
        if (iVar24 < iVar11) {
          LVar17.x = (this->old_trail).data[iVar24].x;
        }
        p.x = 0xfffffffe;
        if (LVar17.x != 0xfffffffe) {
          if (uVar18 == LVar17.x) {
            p.x = uVar18;
            if (iVar24 < iVar11 + -1) {
              do {
                this->old_trail_qhead = iVar24 + 1;
                p.x = (this->old_trail).data[(long)iVar24 + 1].x;
                uVar15 = (this->oldreasons).data[p.x >> 1];
                uVar12 = (ulong)uVar15;
                if (uVar12 == 0xffffffff) break;
                bVar2 = (this->assigns).data[p.x >> 1].value;
                LVar17.x = p.x;
                if (((byte)p.x & 1 ^ bVar2) == 1) {
                  puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                  if (((*(ulong *)(puVar4 + uVar12) & 0xfffffffc00000000) != 0x800000000) &&
                     (puVar4[uVar12 + 2] != p.x)) goto LAB_00113ef1;
                  this->used_backup_lits = this->used_backup_lits + 1;
                  goto LAB_0011434f;
                }
                iVar24 = iVar24 + 1;
                if ((bVar2 & 2) != 0) {
                  puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                  if (((*(ulong *)(puVar4 + uVar12) & 0xfffffffc00000000) != 0x800000000) &&
                     (puVar4[uVar12 + 2] != p.x)) goto LAB_00113ef1;
                  this->used_backup_lits = this->used_backup_lits + 1;
                  uncheckedEnqueue(this,p,(this->trail_lim).sz,uVar15);
                  iVar24 = this->old_trail_qhead;
                  iVar11 = (this->old_trail).sz;
                }
              } while (iVar24 < iVar11 + -1);
            }
          }
          else if (((int)uVar18 >> 1 == LVar17.x >> 1) ||
                  (p.x = LVar17.x,
                  ((byte)LVar17.x & 1 ^ (this->assigns).data[LVar17.x >> 1].value) == 1)) {
LAB_00113ef1:
            reset_old_trail(this);
            p.x = LVar17.x;
          }
        }
      }
      pvVar25 = (pOVar9->occs).data;
      iVar24 = pvVar25[(int)uVar18].sz;
      if (0 < iVar24) {
        pvVar25 = pvVar25 + (int)uVar18;
        lVar23 = 0;
        do {
          pWVar20 = pvVar25->data;
          LVar17.x = pWVar20[lVar23].blocker.x;
          bVar2 = (this->assigns).data[LVar17.x >> 1].value;
          if (((byte)LVar17.x & 1 ^ bVar2) == 1) {
            uVar15 = pWVar20[lVar23].cref;
            goto LAB_0011434f;
          }
          if ((bVar2 & 2) != 0) {
            uncheckedEnqueue(this,LVar17,iVar19,pWVar20[lVar23].cref);
            iVar24 = pvVar25->sz;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar24);
      }
      local_90 = local_48->data;
      pWVar20 = local_90;
      local_7c = uVar14;
      local_38 = (ulong)uVar22;
      if ((long)local_48->sz != 0) {
        pWVar20 = local_90 + local_48->sz;
        uVar18 = uVar18 ^ 1;
        pWVar16 = local_90;
        local_78 = pWVar20;
        do {
          iVar24 = (pWVar16->blocker).x;
          plVar5 = (this->assigns).data;
          if (plVar5[iVar24 >> 1].value == ((byte)iVar24 & 1)) {
            WVar6 = *pWVar16;
            pWVar16 = pWVar16 + 1;
            *local_90 = WVar6;
            local_90 = local_90 + 1;
          }
          else {
            local_88.cref = pWVar16->cref;
            uVar12 = (ulong)local_88.cref;
            puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            puVar1 = &(this->statistics).solveSteps;
            *puVar1 = *puVar1 + 1;
            puVar10 = (ulong *)(puVar4 + uVar12);
            LVar17.x = (int)puVar10[1];
            if (LVar17.x == uVar18) {
              LVar17.x = *(int *)((long)puVar10 + 0xc);
              *(int *)(puVar10 + 1) = LVar17.x;
              *(uint *)((long)puVar10 + 0xc) = uVar18;
            }
            pWVar16 = pWVar16 + 1;
            local_88.blocker.x = LVar17.x;
            if ((LVar17.x == iVar24) || (plVar5[LVar17.x >> 1].value != ((byte)LVar17.x & 1))) {
              if (0xbffffffff < *puVar10) {
                uVar13 = 0;
                uVar21 = 2;
                do {
                  iVar24 = (int)puVar4[uVar12 + uVar21 + 2] >> 1;
                  if (((byte)puVar4[uVar12 + uVar21 + 2] & 1 ^ plVar5[iVar24].value) != 1) {
                    if ((this->assumptions).sz < (this->vardata).data[iVar24].level) {
                      iVar24 = (int)uVar21;
                      goto LAB_0011416f;
                    }
                    uVar13 = uVar21 & 0xffffffff;
                  }
                  iVar24 = (int)uVar13;
                  uVar21 = uVar21 + 1;
                } while (*puVar10 >> 0x22 != uVar21);
                local_70 = uVar12;
                if (iVar24 != 0) {
LAB_0011416f:
                  *(undefined4 *)((long)puVar10 + 0xc) =
                       *(undefined4 *)((long)puVar10 + (long)iVar24 * 4 + 8);
                  *(uint *)((long)puVar10 + (long)iVar24 * 4 + 8) = uVar18;
                  uVar15 = *(uint *)((long)puVar10 + 0xc);
                  if (plVar5[(int)uVar15 >> 1].value == ((byte)uVar15 & 1)) {
                    local_68.l.x = uVar15 ^ 1;
                    local_68.w.blocker.x = LVar17.x;
                    local_68.w.cref = local_88.cref;
                    local_70 = uVar12;
                    vec<Minisat::Solver::watchItem>::push(local_58,&local_68);
                    pWVar20 = local_78;
                  }
                  else {
                    local_70 = uVar12;
                    vec<Minisat::Watcher>::push
                              ((local_50->occs).data + ((long)(int)uVar15 ^ 1),&local_88);
                    pWVar20 = local_78;
                  }
                  goto LAB_001142d6;
                }
              }
              pWVar26 = local_90 + 1;
              WVar6.blocker.x = LVar17.x;
              WVar6.cref = local_88.cref;
              *local_90 = WVar6;
              plVar5 = (this->assigns).data;
              if (((byte)LVar17.x & 1 ^ plVar5[LVar17.x >> 1].value) == 1) {
                this->qhead = (this->trail).sz;
                pWVar20 = local_78;
                local_7c = local_88.cref;
                if (local_78 <= pWVar16) goto LAB_001141e7;
                do {
                  WVar6 = *pWVar16;
                  pWVar16 = pWVar16 + 1;
                  *pWVar26 = WVar6;
                  pWVar26 = pWVar26 + 1;
                  local_90 = pWVar26;
                } while (pWVar16 < local_78);
              }
              else if (iVar19 == (this->trail_lim).sz) {
                uncheckedEnqueue(this,LVar17,iVar19,local_88.cref);
                pWVar20 = local_78;
                local_90 = pWVar26;
              }
              else {
                iVar24 = iVar19;
                local_70 = uVar12;
                if (0xbffffffff < *puVar10) {
                  uVar13 = 1;
                  uVar21 = 2;
                  do {
                    iVar11 = (this->vardata).data[(int)puVar4[uVar12 + uVar21 + 2] >> 1].level;
                    if (iVar24 < iVar11) {
                      uVar13 = uVar21 & 0xffffffff;
                      iVar24 = iVar11;
                    }
                    uVar21 = uVar21 + 1;
                  } while (*puVar10 >> 0x22 != uVar21);
                  iVar11 = (int)uVar13;
                  if (iVar11 != 1) {
                    uVar3 = *(undefined4 *)((long)puVar10 + 0xc);
                    *(undefined4 *)((long)puVar10 + 0xc) =
                         *(undefined4 *)((long)puVar10 + (long)iVar11 * 4 + 8);
                    *(undefined4 *)((long)puVar10 + (long)iVar11 * 4 + 8) = uVar3;
                    uVar15 = *(uint *)((long)puVar10 + 0xc);
                    pWVar26 = local_90;
                    if (plVar5[(int)uVar15 >> 1].value == ((byte)uVar15 & 1)) {
                      local_68.l.x = uVar15 ^ 1;
                      local_68.w.blocker.x = LVar17.x;
                      local_68.w.cref = local_88.cref;
                      vec<Minisat::Solver::watchItem>::push(local_58,&local_68);
                    }
                    else {
                      vec<Minisat::Watcher>::push
                                ((local_50->occs).data + ((long)(int)uVar15 ^ 1),&local_88);
                    }
                  }
                }
                local_90 = pWVar26;
                uncheckedEnqueue(this,LVar17,iVar24,(CRef)local_70);
                pWVar20 = local_78;
              }
            }
            else {
              WVar8.blocker.x = LVar17.x;
              WVar8.cref = local_88.cref;
              *local_90 = WVar8;
LAB_001141e7:
              local_90 = local_90 + 1;
            }
          }
LAB_001142d6:
        } while (pWVar16 != pWVar20);
      }
      iVar19 = (int)((ulong)((long)pWVar20 - (long)local_90) >> 3);
      if (0 < iVar19) {
        local_48->sz = local_48->sz - iVar19;
      }
      iVar19 = this->qhead;
      uVar22 = (uint)local_38;
      uVar12 = local_38;
      uVar14 = local_7c;
      uVar15 = local_7c;
      LVar17.x = p.x;
    } while (iVar19 < (this->trail).sz);
  }
  else {
    uVar22 = 0;
    uVar15 = 0xffffffff;
  }
LAB_0011434f:
  if (0 < (this->lazySATwatch).sz) {
    lVar23 = 0;
    lVar27 = 0;
    do {
      pwVar7 = (this->lazySATwatch).data;
      vec<Minisat::Watcher>::push
                ((this->watches).occs.data + *(int *)((long)&(pwVar7->l).x + lVar23),
                 (Watcher *)((long)&(pwVar7->w).cref + lVar23));
      lVar27 = lVar27 + 1;
      lVar23 = lVar23 + 0xc;
    } while (lVar27 < (this->lazySATwatch).sz);
  }
  this->propagations = this->propagations + (long)(int)uVar22;
  this->simpDB_props = this->simpDB_props - (long)(int)uVar22;
  return uVar15;
}

Assistant:

CRef Solver::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    lazySATwatch.clear();
    Lit old_trail_top = lit_Undef;
    CRef old_reason = CRef_Undef;
    watches.cleanAll();
    watches_bin.cleanAll();

    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        int currLevel = level(var(p));
        vec<Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;

        /* begin old trail reconstruction */
        if (use_backuped_trail) {
            if (old_trail_qhead < old_trail.size()) {
                old_trail_top = old_trail[old_trail_qhead];
                old_reason = oldreasons[var(old_trail_top)];
            }
            if (old_trail_top != lit_Undef) {
                if (p == old_trail_top) {
                    while (old_trail_qhead < old_trail.size() - 1) {
                        old_trail_qhead++;
                        old_trail_top = old_trail[old_trail_qhead];
                        old_reason = oldreasons[var(old_trail_top)];
                        if (old_reason == CRef_Undef) {
                            break;
                        } else if (value(old_trail_top) == l_False) {
                            const Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will hit a conflict here, the clause is just not structured correctly yet,
                                nor watched correctly. */
                                reset_old_trail();
                                break;
                            }
                            confl = old_reason;
                            used_backup_lits++;
                            TRACE(std::cout
                                  << "c prop: hit conflict during trail restoring, when trying to propagate literal "
                                  << old_trail_top << " with reason[" << old_reason << "] " << new_conflict << std::endl;);
                            assert((new_conflict.size() == 2 || new_conflict[0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            /* No need to touch watch lists, we will backtrack this level anyways! */
                            goto propagation_out;
                        } else if (value(old_trail_top) == l_Undef) {
                            Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will use this unit clause, the clause is just not structured correctly yet */
                                reset_old_trail();
                                break;
                            }
                            used_backup_lits++;
                            TRACE(std::cout << "c prop: enqueue literal " << old_trail_top << " with reason["
                                            << old_reason << "] " << ca[old_reason] << std::endl;);
                            assert((ca[old_reason].size() == 2 || ca[old_reason][0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            uncheckedEnqueue(old_trail_top, decisionLevel(), old_reason);
                        }
                    }
                } else if (var(p) == var(old_trail_top) || value(old_trail_top) == l_False) {
                    reset_old_trail();
                }
            }
        }
        /* end old trail reconstruction */

        vec<Watcher> &ws_bin = watches_bin[p]; // Propagate binary clauses first.
        for (int k = 0; k < ws_bin.size(); k++) {
            Lit the_other = ws_bin[k].blocker;
            if (value(the_other) == l_False) {
                confl = ws_bin[k].cref;
                goto propagation_out;
            } else if (value(the_other) == l_Undef) {
                uncheckedEnqueue(the_other, currLevel, ws_bin[k].cref);
#ifdef PRINT_OUT
                std::cout << "i " << the_other << " l " << currLevel << "\n";
#endif
            }
        }

        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            statistics.solveSteps++;
            const Lit false_lit = ~p;
            if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            const Lit first = c[0];
            const Watcher w = Watcher(cr, first);
            if (first != blocker && value(first) == l_True) {
                *j++ = w;
                continue;
            }

            // Look for new watch:
            int watchPos = 0, avoidLevel = assumptions.size();
            for (int k = 2; k < c.size(); k++) {
                if (value(c[k]) != l_False) {
                    watchPos = k; /* memorize that we found one literal we can watch */
                    if (level(var(c[k])) > avoidLevel) break;
                }
            }

            /* found a position to watch, watch the clause */
            if (watchPos != 0) {
                c[1] = c[watchPos];
                c[watchPos] = false_lit;
                if (value(c[1]) == l_True) {
                    lazySATwatch.push(watchItem(w, ~c[1]));
                } else {
                    watches[~c[1]].push(w);
                }
                goto NextClause;
            }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) *j++ = *i++;
            } else {
                if (currLevel == decisionLevel()) {
                    uncheckedEnqueue(first, currLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << currLevel << "\n";
#endif
                } else {
                    int nMaxLevel = currLevel;
                    int nMaxInd = 1;
                    // pass over all the literals in the clause and find the one with the biggest level
                    for (int nInd = 2; nInd < c.size(); ++nInd) {
                        int nLevel = level(var(c[nInd]));
                        if (nLevel > nMaxLevel) {
                            nMaxLevel = nLevel;
                            nMaxInd = nInd;
                        }
                    }

                    if (nMaxInd != 1) {
                        std::swap(c[1], c[nMaxInd]);
                        j--; // undo last watch
                        if (value(c[1]) == l_True) {
                            lazySATwatch.push(watchItem(w, ~c[1]));
                        } else {
                            watches[~c[1]].push(w);
                        }
                    }

                    uncheckedEnqueue(first, nMaxLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << nMaxLevel << "\n";
#endif
                }
            }

        NextClause:;
        }
        ws.shrink(i - j);
    }

propagation_out:;
    /* we still need to re-add the satisfied clauses to their respective watch lists - in order! */
    for (int k = 0; k < lazySATwatch.size(); ++k) {
        watches[lazySATwatch[k].l].push(lazySATwatch[k].w);
    }

    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}